

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteStateMachine.hpp
# Opt level: O2

void __thiscall
peach::fsm::Node::addTransition<peach::transition::SingleCharTransition,char&>
          (Node *this,shared_ptr<peach::fsm::Node> *nextNode,char *args)

{
  __uniq_ptr_impl<peach::transition::SingleCharTransition,_std::default_delete<peach::transition::SingleCharTransition>_>
  local_20;
  
  std::make_unique<peach::transition::SingleCharTransition,char&>((char *)&local_20);
  std::
  vector<std::pair<std::unique_ptr<peach::transition::CharTransition,std::default_delete<peach::transition::CharTransition>>,std::shared_ptr<peach::fsm::Node>>,std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,std::default_delete<peach::transition::CharTransition>>,std::shared_ptr<peach::fsm::Node>>>>
  ::
  emplace_back<std::unique_ptr<peach::transition::SingleCharTransition,std::default_delete<peach::transition::SingleCharTransition>>,std::shared_ptr<peach::fsm::Node>>
            ((vector<std::pair<std::unique_ptr<peach::transition::CharTransition,std::default_delete<peach::transition::CharTransition>>,std::shared_ptr<peach::fsm::Node>>,std::allocator<std::pair<std::unique_ptr<peach::transition::CharTransition,std::default_delete<peach::transition::CharTransition>>,std::shared_ptr<peach::fsm::Node>>>>
              *)this,(unique_ptr<peach::transition::SingleCharTransition,_std::default_delete<peach::transition::SingleCharTransition>_>
                      *)&local_20,nextNode);
  if (local_20._M_t.
      super__Tuple_impl<0UL,_peach::transition::SingleCharTransition_*,_std::default_delete<peach::transition::SingleCharTransition>_>
      .super__Head_base<0UL,_peach::transition::SingleCharTransition_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_peach::transition::SingleCharTransition_*,_std::default_delete<peach::transition::SingleCharTransition>_>
       )0x0) {
    (**(code **)(*(long *)local_20._M_t.
                          super__Tuple_impl<0UL,_peach::transition::SingleCharTransition_*,_std::default_delete<peach::transition::SingleCharTransition>_>
                          .super__Head_base<0UL,_peach::transition::SingleCharTransition_*,_false>.
                          _M_head_impl + 0x10))();
  }
  return;
}

Assistant:

void addTransition(std::shared_ptr<Node> nextNode, TransitionArgs &&... args)
    {
        auto newTransition = std::make_unique<Transition>(std::forward<TransitionArgs>(args)...);
        transitions_.emplace_back(std::move(newTransition), std::move(nextNode));
    }